

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry_test.cpp
# Opt level: O0

void __thiscall
test::test_most_advanced_license_error::test_method(test_most_advanced_license_error *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_1d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[31],_const_char_(&)[31]> local_1c8;
  assertion_result local_1a8;
  basic_cstring<const_char> local_190;
  basic_cstring<const_char> local_180;
  basic_cstring<const_char> local_170;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[18],_const_char_(&)[18]> local_160;
  allocator local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  assertion_result local_118;
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]> local_d0;
  assertion_result local_b0;
  basic_cstring<const_char> local_98;
  basic_cstring<const_char> local_88;
  AuditEvent_conflict *local_78;
  AuditEvent *event;
  undefined1 local_60 [8];
  EventRegistry er;
  test_most_advanced_license_error *this_local;
  
  er._72_8_ = this;
  license::EventRegistry::EventRegistry((EventRegistry *)local_60);
  license::EventRegistry::addEvent((EventRegistry *)local_60,LICENSE_SPECIFIED,"lic2",(char *)0x0);
  license::EventRegistry::addEvent((EventRegistry *)local_60,LICENSE_FOUND,"lic1",(char *)0x0);
  license::EventRegistry::addEvent((EventRegistry *)local_60,LICENSE_CORRUPTED,"lic1",(char *)0x0);
  license::EventRegistry::turnWarningsIntoErrors((EventRegistry *)local_60);
  local_78 = license::EventRegistry::getLastFailure((EventRegistry *)local_60);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_98);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_88,0x22,&local_98);
    boost::test_tools::assertion_result::assertion_result
              (&local_b0,local_78 != (AuditEvent_conflict *)0x0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d0,plVar3,(char (*) [21])"An error is detected");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
               ,0x7c);
    boost::test_tools::tt_detail::report_assertion(&local_b0,&local_d0,&local_e0,0x22,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>::
    ~lazy_ostream_impl(&local_d0);
    boost::test_tools::assertion_result::~assertion_result(&local_b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_100);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_f0,0x23,&local_100);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"lic1",&local_139);
    bVar2 = std::operator==(&local_138,local_78->license_reference);
    boost::test_tools::assertion_result::assertion_result(&local_118,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_160,plVar3,(char (*) [18])"Error is for lic1");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_170,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
               ,0x7c);
    boost::test_tools::tt_detail::report_assertion(&local_118,&local_160,&local_170,0x23,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[18],_const_char_(&)[18]>::
    ~lazy_ostream_impl(&local_160);
    boost::test_tools::assertion_result::~assertion_result(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_190);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_180,0x24,&local_190);
    boost::test_tools::assertion_result::assertion_result
              (&local_1a8,local_78->event_type == LICENSE_CORRUPTED);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1c8,plVar3,(char (*) [31])"Error is for LICENSE_CORRUPTED");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/EventRegistry_test.cpp"
               ,0x7c);
    boost::test_tools::tt_detail::report_assertion(&local_1a8,&local_1c8,&local_1d8,0x24,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[31],_const_char_(&)[31]>::
    ~lazy_ostream_impl(&local_1c8);
    boost::test_tools::assertion_result::~assertion_result(&local_1a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  license::EventRegistry::~EventRegistry((EventRegistry *)local_60);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_most_advanced_license_error) {
	EventRegistry er;
	er.addEvent(LICENSE_SPECIFIED, "lic2");
	er.addEvent(LICENSE_FOUND, "lic1");
	er.addEvent(LICENSE_CORRUPTED, "lic1");
	er.turnWarningsIntoErrors();
	const AuditEvent *event = er.getLastFailure();
	BOOST_CHECK_MESSAGE(event != nullptr, "An error is detected");
	BOOST_CHECK_MESSAGE(string("lic1") == event->license_reference, "Error is for lic1");
	BOOST_CHECK_MESSAGE(LICENSE_CORRUPTED == event->event_type, "Error is for LICENSE_CORRUPTED");
}